

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallbackFederate.cpp
# Opt level: O0

void __thiscall
helics::CallbackFederate::CallbackFederate(CallbackFederate *this,CallbackFederate *param_2)

{
  function<std::pair<TimeRepresentation<count_time<9,_long>_>,_helics::IterationRequest>_(helics::iteration_time)>
  *in_RSI;
  function<std::pair<TimeRepresentation<count_time<9,_long>_>,_helics::IterationRequest>_(helics::iteration_time)>
  *in_RDI;
  CombinationFederate *unaff_retaddr;
  Federate *in_stack_00000028;
  Federate *in_stack_00000030;
  function<std::pair<TimeRepresentation<count_time<9,_long>_>,_helics::IterationRequest>_(helics::iteration_time)>
  *vtt;
  
  vtt = in_RDI;
  Federate::Federate(in_stack_00000030,in_stack_00000028);
  helics::CombinationFederate::CombinationFederate
            (unaff_retaddr,(void **)vtt,(CombinationFederate *)in_RSI);
  *(element_type **)&(in_RDI->super__Function_base)._M_functor = (element_type *)0xa46698;
  in_RDI[4]._M_invoker = (_Invoker_type)(vtable + 0x140);
  (in_RDI->super__Function_base)._M_manager = (_Manager_type)(vtable + 0x78);
  std::shared_ptr<helics::CallbackFederateOperator>::shared_ptr
            ((shared_ptr<helics::CallbackFederateOperator> *)in_RSI,
             (shared_ptr<helics::CallbackFederateOperator> *)in_RDI);
  *(byte *)&in_RDI[1].super__Function_base._M_manager =
       *(byte *)&in_RSI[1].super__Function_base._M_manager & 1;
  std::function<helics::IterationRequest_()>::function
            ((function<helics::IterationRequest_()> *)in_RSI,
             (function<helics::IterationRequest_()> *)in_RDI);
  std::
  function<std::pair<TimeRepresentation<count_time<9,_long>_>,_helics::IterationRequest>_(helics::iteration_time)>
  ::function(in_RSI,in_RDI);
  std::function<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>)>
  ::function((function<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>)>
              *)in_RSI,
             (function<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>)>
              *)in_RDI);
  return;
}

Assistant:

CallbackFederate::CallbackFederate(CallbackFederate&&) noexcept = default;